

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

uint8_t bit_reader_read(bit_reader_t *r,uint n)

{
  size_t sVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  
  uVar3 = r->current_byte_len;
  uVar5 = (ulong)n;
  uVar6 = 0;
  bVar7 = r->current_byte;
  uVar4 = n;
  if (uVar3 < uVar5) {
    sVar1 = r->byte_index;
    r->byte_index = sVar1 + 1;
    uVar4 = n - (int)uVar3;
    uVar5 = (ulong)uVar4;
    uVar6 = (~(-1 << ((byte)uVar3 & 0x1f)) & (uint)bVar7) << ((byte)uVar4 & 0x1f);
    bVar7 = r->bytes[sVar1 + 1];
    r->current_byte = bVar7;
    uVar3 = 8;
  }
  bVar2 = (byte)(uVar3 - uVar5);
  r->current_byte_len = uVar3 - uVar5;
  return reverse_table
         [((uint)bVar7 & ~(-1 << ((byte)uVar4 & 0x1f)) << (bVar2 & 0x1f)) >> (bVar2 & 0x1f) | uVar6]
         >> (8U - (char)n & 0x1f);
}

Assistant:

uint8_t bit_reader_read(bit_reader_t *r, unsigned int n) {
    unsigned int read = 0;
    unsigned int n_copy = n;

    if (r->current_byte_len < n) {
        read = r->current_byte & ((1 << r->current_byte_len) - 1);
        r->byte_index++;
        r->current_byte = r->bytes[r->byte_index];
        n -= r->current_byte_len;
        r->current_byte_len = 8;
        read <<= n;
    }

    uint8_t copy_mask = (1 << n) - 1;
    copy_mask <<= (r->current_byte_len - n);
    read |= (r->current_byte & copy_mask) >> (r->current_byte_len - n);
    r->current_byte_len -= n;
    return reverse_table[read] >> (8 - n_copy);
}